

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O2

int run_test_metrics_idle_time(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  int cntr;
  uv_timer_t timer;
  
  timer.data = &cntr;
  cntr = 0;
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_configure(puVar2,UV_METRICS_IDLE_TIME);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_timer_start(&timer,timer_spin_cb,1000,0);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = (int64_t)cntr;
          eval_b = 0;
          if (eval_a < 1) {
            pcVar4 = ">";
            pcVar5 = "0";
            pcVar3 = "cntr";
            uVar6 = 0x43;
          }
          else {
            puVar2 = uv_default_loop();
            eval_a = uv_metrics_idle_time(puVar2);
            eval_b = 1500000000;
            if (eval_a < 0x59682f01) {
              eval_b = 500000000;
              if (eval_a < 500000000) {
                pcVar4 = ">=";
                pcVar5 = "(timeout - 500) * 1000000";
                pcVar3 = "idle_time";
                uVar6 = 0x49;
              }
              else {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                eval_a = 0;
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "==";
                pcVar5 = "uv_loop_close(uv_default_loop())";
                pcVar3 = "0";
                uVar6 = 0x4b;
              }
            }
            else {
              pcVar4 = "<=";
              pcVar5 = "(timeout + 500) * 1000000";
              pcVar3 = "idle_time";
              uVar6 = 0x48;
            }
          }
        }
        else {
          pcVar4 = "==";
          pcVar5 = "0";
          pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
          uVar6 = 0x42;
        }
      }
      else {
        pcVar4 = "==";
        pcVar5 = "0";
        pcVar3 = "uv_timer_start(&timer, timer_spin_cb, timeout, 0)";
        uVar6 = 0x40;
      }
    }
    else {
      pcVar4 = "==";
      pcVar5 = "0";
      pcVar3 = "uv_timer_init(uv_default_loop(), &timer)";
      uVar6 = 0x3f;
    }
  }
  else {
    pcVar4 = "==";
    pcVar5 = "0";
    pcVar3 = "uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME)";
    uVar6 = 0x3e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
          ,uVar6,pcVar3,pcVar4,pcVar5,eval_a,pcVar4,eval_b);
  abort();
}

Assistant:

TEST_IMPL(metrics_idle_time) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  const uint64_t timeout = 1000;
  uv_timer_t timer;
  uint64_t idle_time;
  int cntr;

  cntr = 0;
  timer.data = &cntr;

  ASSERT_OK(uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_spin_cb, timeout, 0));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_GT(cntr, 0);

  idle_time = uv_metrics_idle_time(uv_default_loop());

  /* Permissive check that the idle time matches within the timeout ±500 ms. */
  ASSERT_LE(idle_time, (timeout + 500) * UV_NS_TO_MS);
  ASSERT_GE(idle_time, (timeout - 500) * UV_NS_TO_MS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}